

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O2

ALfilter * anon_unknown.dwarf_50b73::LookupFilter(ALCdevice *device,ALuint id)

{
  pointer pFVar1;
  ulong uVar2;
  ALfilter *pAVar3;
  uint uVar4;
  
  uVar4 = id - 1;
  pFVar1 = (device->FilterList).
           super__Vector_base<FilterSubList,_al::allocator<FilterSubList,_8UL>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)(uVar4 >> 6) <
      (ulong)((long)(device->FilterList).
                    super__Vector_base<FilterSubList,_al::allocator<FilterSubList,_8UL>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pFVar1 >> 4)) {
    uVar2 = (ulong)((uVar4 >> 6) << 4);
    pAVar3 = (ALfilter *)0x0;
    if ((*(ulong *)((long)&pFVar1->FreeMask + uVar2) >> ((ulong)uVar4 & 0x3f) & 1) == 0) {
      pAVar3 = (ALfilter *)
               ((ulong)(uVar4 & 0x3f) * 0x28 + *(long *)((long)&pFVar1->Filters + uVar2));
    }
    return pAVar3;
  }
  return (ALfilter *)0x0;
}

Assistant:

inline ALfilter *LookupFilter(ALCdevice *device, ALuint id) noexcept
{
    const size_t lidx{(id-1) >> 6};
    const ALuint slidx{(id-1) & 0x3f};

    if UNLIKELY(lidx >= device->FilterList.size())
        return nullptr;
    FilterSubList &sublist = device->FilterList[lidx];
    if UNLIKELY(sublist.FreeMask & (1_u64 << slidx))
        return nullptr;
    return sublist.Filters + slidx;
}